

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::python::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FileDescriptor *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *other;
  string filename;
  string module_name;
  Printer printer;
  FileDescriptorProto fdp;
  string local_208;
  string local_1e8;
  Printer local_1c8;
  LogMessage local_140;
  FileDescriptorProto local_108;
  ZeroCopyOutputStream *output;
  
  internal::Mutex::Lock(&this->mutex_);
  this->file_ = file;
  anon_unknown_0::ModuleName(&local_1e8,*(string **)file);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_1e8._M_dataplus._M_p,
             local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
  ReplaceCharacters(&local_208,".",'/');
  std::__cxx11::string::append((char *)&local_208);
  FileDescriptorProto::FileDescriptorProto(&local_108);
  FileDescriptor::CopyTo(this->file_,&local_108);
  MessageLite::SerializeToString((MessageLite *)&local_108,&this->file_descriptor_serialized_);
  iVar2 = (*context->_vptr_GeneratorContext[2])(context,&local_208);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  if (output == (ZeroCopyOutputStream *)0x0) {
    internal::LogMessage::LogMessage
              (&local_140,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x14c);
    other = internal::LogMessage::operator<<(&local_140,"CHECK failed: output.get(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_1c8,other);
    internal::LogMessage::~LogMessage(&local_140);
  }
  io::Printer::Printer(&local_1c8,output,'$');
  this->printer_ = &local_1c8;
  pFVar1 = this->file_;
  iVar2 = std::__cxx11::string::compare(*(char **)pFVar1);
  io::Printer::Print(&local_1c8,
                     "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: $filename$\n\nimport sys\n_b=sys.version_info[0]<3 and (lambda x:x) or (lambda x:x.encode(\'latin1\'))\n"
                     ,"filename",*(string **)pFVar1);
  if (0 < *(int *)(pFVar1 + 0x68)) {
    io::Printer::Print(&local_1c8,"from google.protobuf.internal import enum_type_wrapper\n");
  }
  io::Printer::Print(&local_1c8,
                     "from google.protobuf import descriptor as _descriptor\nfrom google.protobuf import message as _message\nfrom google.protobuf import reflection as _reflection\nfrom google.protobuf import symbol_database as _symbol_database\n"
                    );
  if ((0 < *(int *)(pFVar1 + 0x78)) && (*(char *)(*(long *)(pFVar1 + 0xa0) + 0xa5) == '\x01')) {
    io::Printer::Print(&local_1c8,
                       "from google.protobuf import service as _service\nfrom google.protobuf import service_reflection\n"
                      );
  }
  if (iVar2 != 0) {
    io::Printer::Print(&local_1c8,"from google.protobuf import descriptor_pb2\n");
  }
  io::Printer::Print(&local_1c8,
                     "# @@protoc_insertion_point(imports)\n\n_sym_db = _symbol_database.Default()\n"
                    );
  io::Printer::Print(&local_1c8,"\n\n");
  PrintImports(this);
  PrintFileDescriptor(this);
  PrintTopLevelEnums(this);
  PrintTopLevelExtensions(this);
  PrintAllNestedEnumsInFile(this);
  PrintMessageDescriptors(this);
  FixForeignFieldsInDescriptors(this);
  PrintMessages(this);
  FixForeignFieldsInExtensions(this);
  FixAllDescriptorOptions(this);
  if ((0 < *(int *)(file + 0x78)) && (*(char *)(*(long *)(file + 0xa0) + 0xa5) == '\x01')) {
    PrintServices(this);
  }
  io::Printer::Print(&local_1c8,"# @@protoc_insertion_point(module_scope)\n");
  io::Printer::~Printer(&local_1c8);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  internal::Mutex::Unlock(&this->mutex_);
  return (bool)(local_1c8.failed_ ^ 1);
}

Assistant:

bool Generator::Generate(const FileDescriptor* file,
                         const string& parameter,
                         GeneratorContext* context,
                         string* error) const {

  // Completely serialize all Generate() calls on this instance.  The
  // thread-safety constraints of the CodeGenerator interface aren't clear so
  // just be as conservative as possible.  It's easier to relax this later if
  // we need to, but I doubt it will be an issue.
  // TODO(kenton):  The proper thing to do would be to allocate any state on
  //   the stack and use that, so that the Generator class itself does not need
  //   to have any mutable members.  Then it is implicitly thread-safe.
  MutexLock lock(&mutex_);
  file_ = file;
  string module_name = ModuleName(file->name());
  string filename = module_name;
  ReplaceCharacters(&filename, ".", '/');
  filename += ".py";

  FileDescriptorProto fdp;
  file_->CopyTo(&fdp);
  fdp.SerializeToString(&file_descriptor_serialized_);


  google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output.get());
  io::Printer printer(output.get(), '$');
  printer_ = &printer;

  PrintTopBoilerplate(printer_, file_, GeneratingDescriptorProto());
  PrintImports();
  PrintFileDescriptor();
  PrintTopLevelEnums();
  PrintTopLevelExtensions();
  PrintAllNestedEnumsInFile();
  PrintMessageDescriptors();
  FixForeignFieldsInDescriptors();
  PrintMessages();
  // We have to fix up the extensions after the message classes themselves,
  // since they need to call static RegisterExtension() methods on these
  // classes.
  FixForeignFieldsInExtensions();
  // Descriptor options may have custom extensions. These custom options
  // can only be successfully parsed after we register corresponding
  // extensions. Therefore we parse all options again here to recognize
  // custom options that may be unknown when we define the descriptors.
  FixAllDescriptorOptions();
  if (HasGenericServices(file)) {
    PrintServices();
  }

  printer.Print(
    "# @@protoc_insertion_point(module_scope)\n");

  return !printer.failed();
}